

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_cache.hpp
# Opt level: O1

shared_ptr<duckdb::CSVStateMachineCache,_true> __thiscall
duckdb::ObjectCache::GetOrCreate<duckdb::CSVStateMachineCache>(ObjectCache *this,string *key)

{
  pthread_mutex_t *__mutex;
  element_type *peVar1;
  int iVar2;
  iterator iVar3;
  ObjectCacheEntry *pOVar4;
  mapped_type *this_00;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  bool bVar5;
  shared_ptr<duckdb::CSVStateMachineCache,_true> sVar6;
  shared_ptr<duckdb::ObjectCacheEntry,_true> object;
  size_type __dnew;
  shared_ptr<duckdb::ObjectCacheEntry,_true> local_90;
  shared_ptr<duckdb::ObjectCacheEntry,_true> local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60 [2];
  CSVStateMachineCache *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  __mutex = (pthread_mutex_t *)((long)&key[1].field_2 + 8);
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    iVar3 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)key,in_RDX);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_50 = (CSVStateMachineCache *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<duckdb::CSVStateMachineCache,std::allocator<duckdb::CSVStateMachineCache>>
                (&local_48,&local_50,(allocator<duckdb::CSVStateMachineCache> *)&local_70);
      (this->cache)._M_h._M_buckets = (__buckets_ptr)local_50;
      (this->cache)._M_h._M_bucket_count = (size_type)local_48._M_pi;
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
        }
      }
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
      }
      this_00 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)key,in_RDX);
      shared_ptr<duckdb::ObjectCacheEntry,_true>::operator=<duckdb::CSVStateMachineCache,_0>
                (this_00,(shared_ptr<duckdb::CSVStateMachineCache,_true> *)this);
    }
    else {
      peVar1 = *(element_type **)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_true>
                       ._M_cur + 0x28);
      local_90.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)iVar3.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_true>
                   ._M_cur + 0x30);
      if (local_90.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_90.internal.
           super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_90.internal.
                super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_90.internal.
           super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_90.internal.
                super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      bVar5 = true;
      local_90.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar1;
      if (peVar1 != (element_type *)0x0) {
        pOVar4 = shared_ptr<duckdb::ObjectCacheEntry,_true>::operator->(&local_90);
        (*pOVar4->_vptr_ObjectCacheEntry[2])(&local_50,pOVar4);
        local_70 = local_60;
        local_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x17;
        local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ::std::__cxx11::string::_M_create
                             ((ulong *)&local_70,(ulong)&stack0xffffffffffffffd0);
        local_60[0] = local_30;
        *local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x544154535f565343;
        local_70[1] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4e494843414d5f45;
        builtin_strncpy((char *)((long)local_70 + 0xf),"NE_CACHE",8);
        local_68 = local_30;
        *(char *)((long)local_70 + (long)local_30) = '\0';
        if (local_48._M_pi == local_30) {
          if (local_48._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar5 = false;
          }
          else {
            iVar2 = bcmp(local_50,local_70,(size_t)local_48._M_pi);
            bVar5 = iVar2 != 0;
          }
        }
      }
      if (peVar1 != (element_type *)0x0) {
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        if (local_50 != (CSVStateMachineCache *)&stack0xffffffffffffffc0) {
          operator_delete(local_50);
        }
      }
      if (bVar5) {
        (this->cache)._M_h._M_buckets = (__buckets_ptr)0x0;
        (this->cache)._M_h._M_bucket_count = 0;
      }
      else {
        local_80.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_90.internal.
                 super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_80.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_90.internal.
             super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (local_90.internal.
            super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_90.internal.
             super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_90.internal.
                  super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_90.internal.
             super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_90.internal.
                  super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        shared_ptr_cast<duckdb::ObjectCacheEntry,duckdb::CSVStateMachineCache>
                  ((duckdb *)this,&local_80);
        if (local_80.internal.
            super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.internal.
                     super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (local_90.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.internal.
                   super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    pthread_mutex_unlock(__mutex);
    sVar6.internal.super___shared_ptr<duckdb::CSVStateMachineCache,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar6.internal.super___shared_ptr<duckdb::CSVStateMachineCache,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (shared_ptr<duckdb::CSVStateMachineCache,_true>)
           sVar6.internal.
           super___shared_ptr<duckdb::CSVStateMachineCache,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

shared_ptr<T> GetOrCreate(const string &key, ARGS &&... args) {
		lock_guard<mutex> glock(lock);

		auto entry = cache.find(key);
		if (entry == cache.end()) {
			auto value = make_shared_ptr<T>(args...);
			cache[key] = value;
			return value;
		}
		auto object = entry->second;
		if (!object || object->GetObjectType() != T::ObjectType()) {
			return nullptr;
		}
		return shared_ptr_cast<ObjectCacheEntry, T>(object);
	}